

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgm_tree_index_impl.h
# Opt level: O0

void __thiscall
ted_ub::LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM>::
update_prop_desc_when_mapped
          (LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this,
          int node,vector<int,_std::allocator<int>_> *count_mapped_desc,
          vector<int,_std::allocator<int>_> *propagate_mapped_desc_count,
          vector<int,_std::allocator<int>_> *parent,int input_size)

{
  const_reference pvVar1;
  reference pvVar2;
  int input_size_local;
  vector<int,_std::allocator<int>_> *parent_local;
  vector<int,_std::allocator<int>_> *propagate_mapped_desc_count_local;
  vector<int,_std::allocator<int>_> *count_mapped_desc_local;
  int node_local;
  LGMTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexLGM> *this_local;
  
  if (node < input_size + -1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](parent,(long)node);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](count_mapped_desc,(long)*pvVar1);
    *pvVar2 = *pvVar2 + 1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](parent,(long)node);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       (propagate_mapped_desc_count,(long)*pvVar1);
    *pvVar2 = *pvVar2 + 1;
  }
  update_prop_desc_when_not_mapped
            (this,node,count_mapped_desc,propagate_mapped_desc_count,parent,input_size);
  return;
}

Assistant:

void LGMTreeIndex<CostModel, TreeIndex>::update_prop_desc_when_mapped(
    const int node, std::vector<int>& count_mapped_desc,
    std::vector<int>& propagate_mapped_desc_count,
    const std::vector<int>& parent, const int input_size) const {
  if (node < input_size - 1) { // Root has no parent nor the right leaf, and
                               // the nodes of dummy mapping in fill_gaps_in_mapping
                               // do not exist.
    count_mapped_desc[parent[node]] += 1;
    propagate_mapped_desc_count[parent[node]] += 1;
  }
  update_prop_desc_when_not_mapped(node, count_mapped_desc, propagate_mapped_desc_count, parent, input_size);
}